

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void HistogramRemap(VP8LHistogramSet *in,VP8LHistogramSet *out,uint32_t *symbols)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long in_RDX;
  int *in_RSI;
  long in_RDI;
  int idx;
  int64_t cur_bits;
  int k;
  int64_t best_bits;
  int best_out;
  int out_size;
  int in_size;
  VP8LHistogram **out_histo;
  VP8LHistogram **in_histo;
  int i;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  VP8LHistogram *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  VP8LHistogram *a;
  int local_3c;
  int local_1c;
  
  lVar3 = *(long *)(in_RDI + 8);
  iVar1 = in_RSI[1];
  iVar2 = *in_RSI;
  if (iVar2 < 2) {
    for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
      *(undefined4 *)(in_RDX + (long)local_1c * 4) = 0;
    }
  }
  else {
    for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
      local_3c = 0;
      a = (VP8LHistogram *)0x7fffffffffffffff;
      if (*(long *)(lVar3 + (long)local_1c * 8) == 0) {
        *(undefined4 *)(in_RDX + (long)local_1c * 4) =
             *(undefined4 *)(in_RDX + (long)(local_1c + -1) * 4);
      }
      else {
        for (in_stack_ffffffffffffffb4 = 0; in_stack_ffffffffffffffb4 < iVar2;
            in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
          iVar4 = HistogramAddThresh(a,(VP8LHistogram *)
                                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                                     ,(int64_t)in_stack_ffffffffffffffa8,
                                     (int64_t *)
                                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
          if (iVar4 != 0) {
            a = in_stack_ffffffffffffffa8;
            local_3c = in_stack_ffffffffffffffb4;
          }
        }
        *(int *)(in_RDX + (long)local_1c * 4) = local_3c;
      }
    }
  }
  VP8LHistogramSetClear
            ((VP8LHistogramSet *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  *in_RSI = iVar2;
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    if (*(long *)(lVar3 + (long)local_1c * 8) != 0) {
      HistogramAdd((VP8LHistogram *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8,
                   (VP8LHistogram *)
                   CONCAT44(*(undefined4 *)(in_RDX + (long)local_1c * 4),in_stack_ffffffffffffffa0))
      ;
    }
  }
  return;
}

Assistant:

static void HistogramRemap(const VP8LHistogramSet* const in,
                           VP8LHistogramSet* const out,
                           uint32_t* const symbols) {
  int i;
  VP8LHistogram** const in_histo = in->histograms;
  VP8LHistogram** const out_histo = out->histograms;
  const int in_size = out->max_size;
  const int out_size = out->size;
  if (out_size > 1) {
    for (i = 0; i < in_size; ++i) {
      int best_out = 0;
      int64_t best_bits = WEBP_INT64_MAX;
      int k;
      if (in_histo[i] == NULL) {
        // Arbitrarily set to the previous value if unused to help future LZ77.
        symbols[i] = symbols[i - 1];
        continue;
      }
      for (k = 0; k < out_size; ++k) {
        int64_t cur_bits;
        if (HistogramAddThresh(out_histo[k], in_histo[i], best_bits,
                               &cur_bits)) {
          best_bits = cur_bits;
          best_out = k;
        }
      }
      symbols[i] = best_out;
    }
  } else {
    assert(out_size == 1);
    for (i = 0; i < in_size; ++i) {
      symbols[i] = 0;
    }
  }

  // Recompute each out based on raw and symbols.
  VP8LHistogramSetClear(out);
  out->size = out_size;

  for (i = 0; i < in_size; ++i) {
    int idx;
    if (in_histo[i] == NULL) continue;
    idx = symbols[i];
    HistogramAdd(in_histo[i], out_histo[idx], out_histo[idx]);
  }
}